

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestQueue.cpp
# Opt level: O0

void anon_unknown.dwarf_1098d3::writeq(QueueWriter *w,size_t size)

{
  unique_ptr<char[],_std::default_delete<char[]>_> *this;
  char *in_RSI;
  Expression_lhs<bool> *in_RDI;
  unique_ptr<char[],_std::default_delete<char[]>_> buf;
  Result *in_stack_00000090;
  char *in_stack_00000098;
  int in_stack_000000a4;
  char *in_stack_000000a8;
  Enum in_stack_000000b4;
  bool *in_stack_ffffffffffffff80;
  ExpressionDecomposer *in_stack_ffffffffffffff88;
  ExpressionDecomposer *this_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar1;
  QueueWriter *in_stack_ffffffffffffffa0;
  QueueWriter *this_01;
  ExpressionDecomposer local_3c;
  Expression_lhs<bool> local_38;
  QueueWriter local_30;
  char *local_10;
  
  this_00 = &local_3c;
  uVar1 = 0xc;
  local_10 = in_RSI;
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(this_00,DT_REQUIRE);
  binlog::detail::QueueWriter::beginWrite
            (in_stack_ffffffffffffffa0,CONCAT44(uVar1,in_stack_ffffffffffffff98));
  local_38 = doctest::detail::ExpressionDecomposer::operator<<
                       (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  this_01 = &local_30;
  doctest::detail::Expression_lhs::operator_cast_to_Result(in_RDI);
  doctest::detail::decomp_assert
            (in_stack_000000b4,in_stack_000000a8,in_stack_000000a4,in_stack_00000098,
             in_stack_00000090);
  doctest::detail::Result::~Result((Result *)0x207967);
  this = (unique_ptr<char[],_std::default_delete<char[]>_> *)operator_new__((ulong)local_10);
  memset(this,0,(size_t)local_10);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>(this,local_10);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this);
  binlog::detail::QueueWriter::writeBuffer
            (this_01,(void *)CONCAT44(uVar1,in_stack_ffffffffffffff98),(size_t)this_00);
  binlog::detail::QueueWriter::endWrite(this_01);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(this);
  return;
}

Assistant:

void writeq(binlog::detail::QueueWriter& w, std::size_t size)
{
  REQUIRE(w.beginWrite(size));

  std::unique_ptr<char[]> buf(new char[size]());
  w.writeBuffer(buf.get(), size);
  w.endWrite();
}